

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

UBool __thiscall icu_63::Calendar::isEquivalentTo(Calendar *this,Calendar *other)

{
  char *__s1;
  char *__s2;
  int iVar1;
  
  __s1 = *(char **)((this->super_UObject)._vptr_UObject[-1] + 8);
  __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
  if (((__s1 == __s2) || ((*__s1 != '*' && (iVar1 = strcmp(__s1,__s2), iVar1 == 0)))) &&
     ((this->fLenient == other->fLenient &&
      (((((this->fRepeatedWallTime == other->fRepeatedWallTime &&
          (this->fSkippedWallTime == other->fSkippedWallTime)) &&
         (this->fFirstDayOfWeek == other->fFirstDayOfWeek)) &&
        ((this->fMinimalDaysInFirstWeek == other->fMinimalDaysInFirstWeek &&
         (this->fWeekendOnset == other->fWeekendOnset)))) &&
       ((this->fWeekendOnsetMillis == other->fWeekendOnsetMillis &&
        ((this->fWeekendCease == other->fWeekendCease &&
         (this->fWeekendCeaseMillis == other->fWeekendCeaseMillis)))))))))) {
    iVar1 = (*(this->fZone->super_UObject)._vptr_UObject[3])(this->fZone,other->fZone);
    return (char)iVar1 != '\0';
  }
  return '\0';
}

Assistant:

UBool
Calendar::isEquivalentTo(const Calendar& other) const
{
    return typeid(*this) == typeid(other) &&
        fLenient                == other.fLenient &&
        fRepeatedWallTime       == other.fRepeatedWallTime &&
        fSkippedWallTime        == other.fSkippedWallTime &&
        fFirstDayOfWeek         == other.fFirstDayOfWeek &&
        fMinimalDaysInFirstWeek == other.fMinimalDaysInFirstWeek &&
        fWeekendOnset           == other.fWeekendOnset &&
        fWeekendOnsetMillis     == other.fWeekendOnsetMillis &&
        fWeekendCease           == other.fWeekendCease &&
        fWeekendCeaseMillis     == other.fWeekendCeaseMillis &&
        *fZone                  == *other.fZone;
}